

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::refreshSingleLine(Cmd *this,State *state)

{
  string_view str;
  char *pcVar1;
  size_type sVar2;
  undefined1 auVar3 [16];
  undefined1 local_98 [8];
  string ab;
  size_t pos;
  string_view buf_view;
  size_t plen;
  char seq [64];
  State *state_local;
  Cmd *this_local;
  
  seq._56_8_ = state;
  buf_view._M_str = (char *)std::__cxx11::string::size();
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)seq._56_8_);
  buf_view._M_len = auVar3._8_8_;
  pos = auVar3._0_8_;
  ab.field_2._8_8_ = *(undefined8 *)(seq._56_8_ + 0x20);
  std::__cxx11::string::string((string *)local_98);
  for (; *(char **)(seq._56_8_ + 0x30) <= buf_view._M_str + ab.field_2._8_8_;
      ab.field_2._8_8_ = ab.field_2._8_8_ + -1) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,1);
  }
  while (pcVar1 = buf_view._M_str,
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&pos),
        *(char **)(seq._56_8_ + 0x30) < pcVar1 + sVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,1);
  }
  std::__cxx11::string::append(local_98);
  std::__cxx11::string::append((string *)local_98);
  if ((*(byte *)(seq._56_8_ + 0x48) & 1) == 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)local_98,(basic_string_view<char,_std::char_traits<char>_> *)&pos);
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
    std::__cxx11::string::append((ulong)local_98,(char)sVar2);
  }
  refreshShowHints(this,(string *)local_98,(State *)seq._56_8_,(int)buf_view._M_str);
  std::__cxx11::string::append(local_98);
  snprintf((char *)&plen,0x40,"\r\x1b[%dC",(ulong)(uint)(ab.field_2._8_4_ + (int)buf_view._M_str));
  std::__cxx11::string::append(local_98);
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
  write_string(this,str);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void refreshSingleLine(State *state) {
		char seq[64];
		const size_t plen = prompt.size();
		std::string_view buf_view(state->buf);
		size_t pos = state->pos;
		std::string ab;

		while (plen + pos >= state->cols) {
			buf_view.remove_prefix(1);
			pos--;
		}

		while (plen + buf_view.size() > state->cols) {
			buf_view.remove_suffix(1);
		}

		// Cursor to left edge
		ab.append("\r");

		// Write the prompt and the current buffer content
		ab.append(prompt);

		if (state->mask_mode) {
			ab.append(buf_view.size(), '*');
		} else {
			ab.append(buf_view);
		}
		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// Erase to right
		ab.append("\x1b[0K");

		// Move cursor to original position.
		snprintf(seq, sizeof(seq), "\r\x1b[%dC", static_cast<int>(pos + plen));
		ab.append(seq);

		write_string(ab);
	}